

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_gzip.c
# Opt level: O3

ssize_t gzip_filter_read(archive_read_filter *self,void **p)

{
  uInt uVar1;
  z_streamp strm;
  z_streamp pzVar2;
  uint uVar3;
  int iVar4;
  ssize_t request;
  uLong uVar5;
  Bytef *pBVar6;
  void *pvVar7;
  long lVar8;
  char *fmt;
  int64_t request_00;
  archive_read_filter *filter;
  archive_read *a;
  ssize_t avail_in;
  uInt local_40;
  undefined4 uStack_3c;
  uInt local_38;
  undefined4 uStack_34;
  
  strm = (z_streamp)self->data;
  strm->next_out = *(Bytef **)&strm[1].avail_in;
  uVar1 = (uInt)strm[1].total_in;
  strm->avail_out = uVar1;
  if (uVar1 != 0) {
    do {
      if ((char)strm[1].total_out != '\0') break;
      if (*(char *)&strm[1].next_in == '\0') {
        pzVar2 = (z_streamp)self->data;
        request = peek_at_header(self->upstream,(int *)0x0);
        if (request != 0) {
          __archive_read_filter_consume(self->upstream,request);
          uVar5 = cm_zlib_crc32(0,(uchar *)0x0,0);
          *(uLong *)&pzVar2[1].avail_out = uVar5;
          pBVar6 = (Bytef *)__archive_read_filter_ahead(self->upstream,1,(ssize_t *)&local_38);
          pzVar2->next_in = pBVar6;
          pzVar2->avail_in = local_38;
          uVar3 = cm_zlib_inflateInit2_(pzVar2,-0xf,"1.2.3",0x70);
          if (uVar3 == 0) {
            *(undefined1 *)&pzVar2[1].next_in = 1;
            goto LAB_0044c690;
          }
          if (uVar3 == 0xfffffffa) {
            a = self->archive;
            fmt = "Internal error initializing compression library: invalid library version";
          }
          else {
            if (uVar3 == 0xfffffffc) {
              a = self->archive;
              fmt = "Internal error initializing compression library: out of memory";
              iVar4 = 0xc;
              goto LAB_0044c7c6;
            }
            if (uVar3 != 0xfffffffe) {
              archive_set_error(&self->archive->archive,-1,
                                "Internal error initializing compression library:  Zlib error %d",
                                (ulong)uVar3);
              return -0x1e;
            }
            a = self->archive;
            fmt = "Internal error initializing compression library: invalid setup parameter";
          }
LAB_0044c7c1:
          iVar4 = -1;
LAB_0044c7c6:
          archive_set_error(&a->archive,iVar4,fmt);
          return -0x1e;
        }
        *(undefined1 *)&strm[1].total_out = 1;
        break;
      }
LAB_0044c690:
      pBVar6 = (Bytef *)__archive_read_filter_ahead(self->upstream,1,(ssize_t *)&local_40);
      strm->next_in = pBVar6;
      if (pBVar6 == (Bytef *)0x0) {
        a = self->archive;
        fmt = "truncated gzip input";
        goto LAB_0044c7c1;
      }
      strm->avail_in = local_40;
      iVar4 = cm_zlib_inflate(strm,0);
      if (iVar4 == 1) {
        __archive_read_filter_consume
                  (self->upstream,CONCAT44(uStack_3c,local_40) - (ulong)strm->avail_in);
        pzVar2 = (z_streamp)self->data;
        *(undefined1 *)&pzVar2[1].next_in = 0;
        iVar4 = cm_zlib_inflateEnd(pzVar2);
        if (iVar4 != 0) {
          a = self->archive;
          fmt = "Failed to clean up gzip decompressor";
          goto LAB_0044c7c1;
        }
        pvVar7 = __archive_read_filter_ahead(self->upstream,8,(ssize_t *)&local_38);
        if (pvVar7 == (void *)0x0) {
          return -0x1e;
        }
        if (CONCAT44(uStack_34,local_38) == 0) {
          return -0x1e;
        }
        filter = self->upstream;
        request_00 = 8;
      }
      else {
        if (iVar4 != 0) {
          a = self->archive;
          fmt = "gzip decompression failed";
          goto LAB_0044c7c1;
        }
        filter = self->upstream;
        request_00 = CONCAT44(uStack_3c,local_40) - (ulong)strm->avail_in;
      }
      __archive_read_filter_consume(filter,request_00);
    } while (strm->avail_out != 0);
  }
  pvVar7 = *(void **)&strm[1].avail_in;
  lVar8 = (long)strm->next_out - (long)pvVar7;
  strm[1].next_out = strm[1].next_out + lVar8;
  if (lVar8 == 0) {
    pvVar7 = (void *)0x0;
  }
  *p = pvVar7;
  return lVar8;
}

Assistant:

static ssize_t
gzip_filter_read(struct archive_read_filter *self, const void **p)
{
	struct private_data *state;
	size_t decompressed;
	ssize_t avail_in;
	int ret;

	state = (struct private_data *)self->data;

	/* Empty our output buffer. */
	state->stream.next_out = state->out_block;
	state->stream.avail_out = (uInt)state->out_block_size;

	/* Try to fill the output buffer. */
	while (state->stream.avail_out > 0 && !state->eof) {
		/* If we're not in a stream, read a header
		 * and initialize the decompression library. */
		if (!state->in_stream) {
			ret = consume_header(self);
			if (ret == ARCHIVE_EOF) {
				state->eof = 1;
				break;
			}
			if (ret < ARCHIVE_OK)
				return (ret);
		}

		/* Peek at the next available data. */
		/* ZLib treats stream.next_in as const but doesn't declare
		 * it so, hence this ugly cast. */
		state->stream.next_in = (unsigned char *)(uintptr_t)
		    __archive_read_filter_ahead(self->upstream, 1, &avail_in);
		if (state->stream.next_in == NULL) {
			archive_set_error(&self->archive->archive,
			    ARCHIVE_ERRNO_MISC,
			    "truncated gzip input");
			return (ARCHIVE_FATAL);
		}
		state->stream.avail_in = (uInt)avail_in;

		/* Decompress and consume some of that data. */
		ret = inflate(&(state->stream), 0);
		switch (ret) {
		case Z_OK: /* Decompressor made some progress. */
			__archive_read_filter_consume(self->upstream,
			    avail_in - state->stream.avail_in);
			break;
		case Z_STREAM_END: /* Found end of stream. */
			__archive_read_filter_consume(self->upstream,
			    avail_in - state->stream.avail_in);
			/* Consume the stream trailer; release the
			 * decompression library. */
			ret = consume_trailer(self);
			if (ret < ARCHIVE_OK)
				return (ret);
			break;
		default:
			/* Return an error. */
			archive_set_error(&self->archive->archive,
			    ARCHIVE_ERRNO_MISC,
			    "gzip decompression failed");
			return (ARCHIVE_FATAL);
		}
	}

	/* We've read as much as we can. */
	decompressed = state->stream.next_out - state->out_block;
	state->total_out += decompressed;
	if (decompressed == 0)
		*p = NULL;
	else
		*p = state->out_block;
	return (decompressed);
}